

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O3

int testValidPadding(void)

{
  RepeatedField<long> *this;
  int iVar1;
  uint uVar2;
  Rep *pRVar3;
  ulong uVar4;
  bool bVar5;
  FeatureType *pFVar6;
  long *plVar7;
  FeatureDescription *pFVar8;
  ArrayFeatureType *pAVar9;
  NeuralNetworkLayer *pNVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  void *pvVar12;
  LayerUnion this_00;
  BorderAmounts *pBVar13;
  BorderAmounts_EdgeSizes *pBVar14;
  PaddingLayerParams_PaddingConstant *pPVar15;
  ostream *poVar16;
  undefined8 *puVar17;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *pRVar18;
  RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *this_01;
  Arena *pAVar19;
  Model m1;
  Result res;
  Model local_70;
  Result local_40;
  
  CoreML::Specification::Model::Model(&local_70,(Arena *)0x0,false);
  if (local_70.description_ == (ModelDescription *)0x0) {
    pAVar19 = (Arena *)(local_70.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((local_70.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar19 = *(Arena **)pAVar19;
    }
    local_70.description_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                   (pAVar19);
  }
  pRVar3 = ((local_70.description_)->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar3 == (Rep *)0x0) {
LAB_0017466b:
    pRVar18 = &(local_70.description_)->input_;
    pFVar8 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                       ((pRVar18->super_RepeatedPtrFieldBase).arena_);
    pvVar12 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&pRVar18->super_RepeatedPtrFieldBase,pFVar8);
  }
  else {
    iVar1 = ((local_70.description_)->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar3->allocated_size <= iVar1) goto LAB_0017466b;
    ((local_70.description_)->input_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
    pvVar12 = pRVar3->elements[iVar1];
  }
  puVar17 = (undefined8 *)(*(ulong *)((long)pvVar12 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar12 + 8) & 1) != 0) {
    puVar17 = (undefined8 *)*puVar17;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar12 + 0x10),"input",puVar17);
  pFVar6 = *(FeatureType **)((long)pvVar12 + 0x20);
  if (pFVar6 == (FeatureType *)0x0) {
    pAVar19 = (Arena *)(*(ulong *)((long)pvVar12 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar12 + 8) & 1) != 0) {
      pAVar19 = *(Arena **)pAVar19;
    }
    pFVar6 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar19);
    *(FeatureType **)((long)pvVar12 + 0x20) = pFVar6;
  }
  if (pFVar6->_oneof_case_[0] == 5) {
    pAVar9 = (pFVar6->Type_).multiarraytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar6);
    pFVar6->_oneof_case_[0] = 5;
    uVar4 = (pFVar6->super_MessageLite)._internal_metadata_.ptr_;
    pAVar19 = (Arena *)(uVar4 & 0xfffffffffffffffc);
    if ((uVar4 & 1) != 0) {
      pAVar19 = *(Arena **)pAVar19;
    }
    pAVar9 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                       (pAVar19);
    (pFVar6->Type_).multiarraytype_ = pAVar9;
  }
  this = &pAVar9->shape_;
  uVar2 = (pAVar9->shape_).current_size_;
  if (uVar2 == (pAVar9->shape_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(this,uVar2 + 1);
    plVar7 = google::protobuf::RepeatedField<long>::elements(this);
    plVar7[uVar2] = 5;
  }
  else {
    plVar7 = google::protobuf::RepeatedField<long>::elements(this);
    plVar7[uVar2] = 5;
  }
  this->current_size_ = uVar2 + 1;
  if (local_70.description_ == (ModelDescription *)0x0) {
    pAVar19 = (Arena *)(local_70.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((local_70.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar19 = *(Arena **)pAVar19;
    }
    local_70.description_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                   (pAVar19);
  }
  pRVar3 = ((local_70.description_)->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar3 == (Rep *)0x0) {
LAB_00174796:
    pRVar18 = &(local_70.description_)->output_;
    pFVar8 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                       ((pRVar18->super_RepeatedPtrFieldBase).arena_);
    pvVar12 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&pRVar18->super_RepeatedPtrFieldBase,pFVar8);
  }
  else {
    iVar1 = ((local_70.description_)->output_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar3->allocated_size <= iVar1) goto LAB_00174796;
    ((local_70.description_)->output_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
    pvVar12 = pRVar3->elements[iVar1];
  }
  puVar17 = (undefined8 *)(*(ulong *)((long)pvVar12 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar12 + 8) & 1) != 0) {
    puVar17 = (undefined8 *)*puVar17;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar12 + 0x10),"probs",puVar17);
  pFVar6 = *(FeatureType **)((long)pvVar12 + 0x20);
  if (pFVar6 == (FeatureType *)0x0) {
    pAVar19 = (Arena *)(*(ulong *)((long)pvVar12 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar12 + 8) & 1) != 0) {
      pAVar19 = *(Arena **)pAVar19;
    }
    pFVar6 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar19);
    *(FeatureType **)((long)pvVar12 + 0x20) = pFVar6;
  }
  if (pFVar6->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar6);
    pFVar6->_oneof_case_[0] = 5;
    uVar4 = (pFVar6->super_MessageLite)._internal_metadata_.ptr_;
    pAVar19 = (Arena *)(uVar4 & 0xfffffffffffffffc);
    if ((uVar4 & 1) != 0) {
      pAVar19 = *(Arena **)pAVar19;
    }
    pAVar9 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                       (pAVar19);
    (pFVar6->Type_).multiarraytype_ = pAVar9;
  }
  if (local_70._oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(&local_70);
    local_70._oneof_case_[0] = 500;
    pAVar19 = (Arena *)(local_70.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((local_70.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar19 = *(Arena **)pAVar19;
    }
    local_70.Type_.neuralnetwork_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetwork>(pAVar19);
  }
  pRVar3 = (((RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
            &(local_70.Type_.pipeline_)->models_)->super_RepeatedPtrFieldBase).rep_;
  if (pRVar3 == (Rep *)0x0) {
LAB_00174890:
    this_01 = (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
              &(local_70.Type_.pipeline_)->models_;
    pNVar10 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetworkLayer>
                        ((this_01->super_RepeatedPtrFieldBase).arena_);
    pNVar10 = (NeuralNetworkLayer *)
              google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        ((RepeatedPtrFieldBase *)this_01,pNVar10);
  }
  else {
    iVar1 = (local_70.Type_.treeensembleregressor_)->postevaluationtransform_;
    if (pRVar3->allocated_size <= iVar1) goto LAB_00174890;
    (local_70.Type_.treeensembleregressor_)->postevaluationtransform_ = iVar1 + 1;
    pNVar10 = (NeuralNetworkLayer *)pRVar3->elements[iVar1];
  }
  pRVar3 = (pNVar10->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar3 == (Rep *)0x0) {
LAB_001748c9:
    pbVar11 = google::protobuf::Arena::Create<std::__cxx11::string>
                        ((pNVar10->input_).super_RepeatedPtrFieldBase.arena_);
    pvVar12 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pNVar10->input_).super_RepeatedPtrFieldBase,pbVar11);
  }
  else {
    iVar1 = (pNVar10->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar3->allocated_size <= iVar1) goto LAB_001748c9;
    (pNVar10->input_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
    pvVar12 = pRVar3->elements[iVar1];
  }
  std::__cxx11::string::_M_replace((ulong)pvVar12,0,*(char **)((long)pvVar12 + 8),0x3a8ef3);
  pRVar3 = (pNVar10->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar3 != (Rep *)0x0) {
    iVar1 = (pNVar10->output_).super_RepeatedPtrFieldBase.current_size_;
    if (iVar1 < pRVar3->allocated_size) {
      (pNVar10->output_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
      pvVar12 = pRVar3->elements[iVar1];
      goto LAB_00174934;
    }
  }
  pbVar11 = google::protobuf::Arena::Create<std::__cxx11::string>
                      ((pNVar10->output_).super_RepeatedPtrFieldBase.arena_);
  pvVar12 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                      (&(pNVar10->output_).super_RepeatedPtrFieldBase,pbVar11);
LAB_00174934:
  std::__cxx11::string::_M_replace((ulong)pvVar12,0,*(char **)((long)pvVar12 + 8),0x3977ad);
  if (pNVar10->_oneof_case_[0] == 200) {
    this_00 = pNVar10->layer_;
  }
  else {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pNVar10);
    pNVar10->_oneof_case_[0] = 200;
    uVar4 = (pNVar10->super_MessageLite)._internal_metadata_.ptr_;
    pAVar19 = (Arena *)(uVar4 & 0xfffffffffffffffc);
    if ((uVar4 & 1) != 0) {
      pAVar19 = *(Arena **)pAVar19;
    }
    this_00.padding_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::PaddingLayerParams>
                   (pAVar19);
    (pNVar10->layer_).padding_ = (PaddingLayerParams *)this_00;
  }
  pBVar13 = (BorderAmounts *)((this_00.activation_)->NonlinearityType_).prelu_;
  if (pBVar13 == (BorderAmounts *)0x0) {
    uVar4 = ((this_00.convolution_)->super_MessageLite)._internal_metadata_.ptr_;
    pAVar19 = (Arena *)(uVar4 & 0xfffffffffffffffc);
    if ((uVar4 & 1) != 0) {
      pAVar19 = *(Arena **)pAVar19;
    }
    pBVar13 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::BorderAmounts>
                        (pAVar19);
    ((this_00.activation_)->NonlinearityType_).prelu_ = (ActivationPReLU *)pBVar13;
  }
  pRVar3 = (pBVar13->borderamounts_).super_RepeatedPtrFieldBase.rep_;
  if ((pRVar3 == (Rep *)0x0) ||
     (iVar1 = (pBVar13->borderamounts_).super_RepeatedPtrFieldBase.current_size_,
     pRVar3->allocated_size <= iVar1)) {
    pBVar14 = google::protobuf::Arena::
              CreateMaybeMessage<CoreML::Specification::BorderAmounts_EdgeSizes>
                        ((pBVar13->borderamounts_).super_RepeatedPtrFieldBase.arena_);
    google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
              (&(pBVar13->borderamounts_).super_RepeatedPtrFieldBase,pBVar14);
    pBVar13 = (BorderAmounts *)((this_00.activation_)->NonlinearityType_).prelu_;
    if (pBVar13 == (BorderAmounts *)0x0) {
      uVar4 = ((this_00.convolution_)->super_MessageLite)._internal_metadata_.ptr_;
      pAVar19 = (Arena *)(uVar4 & 0xfffffffffffffffc);
      if ((uVar4 & 1) != 0) {
        pAVar19 = *(Arena **)pAVar19;
      }
      pBVar13 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::BorderAmounts>
                          (pAVar19);
      ((this_00.activation_)->NonlinearityType_).prelu_ = (ActivationPReLU *)pBVar13;
    }
  }
  else {
    (pBVar13->borderamounts_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
  }
  pRVar3 = (pBVar13->borderamounts_).super_RepeatedPtrFieldBase.rep_;
  if ((pRVar3 == (Rep *)0x0) ||
     (iVar1 = (pBVar13->borderamounts_).super_RepeatedPtrFieldBase.current_size_,
     pRVar3->allocated_size <= iVar1)) {
    pBVar14 = google::protobuf::Arena::
              CreateMaybeMessage<CoreML::Specification::BorderAmounts_EdgeSizes>
                        ((pBVar13->borderamounts_).super_RepeatedPtrFieldBase.arena_);
    google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
              (&(pBVar13->borderamounts_).super_RepeatedPtrFieldBase,pBVar14);
  }
  else {
    (pBVar13->borderamounts_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
  }
  if ((this_00.padding_)->_oneof_case_[0] != 1) {
    CoreML::Specification::PaddingLayerParams::clear_PaddingType(this_00.padding_);
    (this_00.padding_)->_oneof_case_[0] = 1;
    uVar4 = ((this_00.convolution_)->super_MessageLite)._internal_metadata_.ptr_;
    pAVar19 = (Arena *)(uVar4 & 0xfffffffffffffffc);
    if ((uVar4 & 1) != 0) {
      pAVar19 = *(Arena **)pAVar19;
    }
    pPVar15 = google::protobuf::Arena::
              CreateMaybeMessage<CoreML::Specification::PaddingLayerParams_PaddingConstant>(pAVar19)
    ;
    ((PaddingTypeUnion *)&(this_00.innerproduct_)->bias_)->constant_ = pPVar15;
  }
  CoreML::validate<(MLModelType)500>(&local_40,&local_70);
  bVar5 = CoreML::Result::good(&local_40);
  if (!bVar5) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x68);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar16 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0xba5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar16,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar16,"(res).good()",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar16," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar16 + -0x18) + (char)poVar16);
    std::ostream::put((char)poVar16);
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.m_message._M_dataplus._M_p != &local_40.m_message.field_2) {
    operator_delete(local_40.m_message._M_dataplus._M_p,
                    local_40.m_message.field_2._M_allocated_capacity + 1);
  }
  CoreML::Specification::Model::~Model(&local_70);
  return (uint)!bVar5;
}

Assistant:

int testValidPadding() {

    Specification::Model m1;

    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("input");
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(5);

    auto *out3 = m1.mutable_description()->add_output();
    out3->set_name("probs");
    out3->mutable_type()->mutable_multiarraytype();

    const auto nn = m1.mutable_neuralnetwork();

    Specification::NeuralNetworkLayer *paddingLayer = nn->add_layers();
    paddingLayer->add_input("input");
    paddingLayer->add_output("probs");
    auto *params = paddingLayer->mutable_padding();

    // If border amounts set, they need to be set in both directions
    params->mutable_paddingamounts()->add_borderamounts();
    params->mutable_paddingamounts()->add_borderamounts();

    (void)params->mutable_constant();

    Result res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_GOOD(res);
    return 0;
}